

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O3

void av1_highbd_warp_affine_sse4_1
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  WarpedFilterCoeff aWVar1 [8];
  WarpedFilterCoeff aWVar2 [8];
  WarpedFilterCoeff aWVar3 [8];
  WarpedFilterCoeff aWVar4 [8];
  int iVar5;
  int iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  byte bVar44;
  byte bVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  byte bVar63;
  uint uVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  long lVar70;
  long lVar72;
  uint16_t *puVar73;
  long lVar74;
  ulong uVar75;
  uint uVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  uint uVar80;
  int iVar81;
  long lVar82;
  int iVar83;
  undefined1 (*pauVar84) [16];
  uint uVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  undefined2 *puVar94;
  int iVar95;
  uint uVar96;
  int iVar97;
  long lVar98;
  int iVar99;
  long lVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  int iVar132;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  int iVar133;
  __m128i src_1_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  __m128i round_const;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  ushort uVar174;
  short sVar175;
  ushort uVar193;
  ushort uVar195;
  ushort uVar197;
  ushort uVar199;
  ushort uVar200;
  ushort uVar201;
  undefined1 auVar177 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  ushort uVar202;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  short sVar194;
  short sVar196;
  short sVar198;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  int iVar210;
  int iVar220;
  int iVar221;
  __m128i src_1;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  int iVar222;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  __m128i tmp [15];
  int local_2f4;
  int local_2d4;
  undefined8 uStack_230;
  short local_178;
  short sStack_176;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_128 [16];
  undefined2 local_118 [16];
  undefined2 local_f8 [32];
  undefined2 local_b8 [68];
  long lVar71;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar178 [16];
  undefined8 uVar176;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  
  uVar96 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar85 = 0xe - uVar96;
    uVar80 = conv_params->round_1;
  }
  else {
    uVar80 = conv_params->round_1;
    uVar85 = uVar80;
  }
  uVar76 = 0xff;
  if (bd == 0xc) {
    uVar76 = 0xfff;
  }
  uVar64 = 0x3ff;
  if (bd != 10) {
    uVar64 = uVar76;
  }
  if (0 < p_height) {
    uVar76 = 0xe - (uVar80 + uVar96);
    bVar63 = (byte)bd;
    bVar44 = (bVar63 + 0xe) - (char)(uVar80 + uVar96);
    bVar45 = (byte)uVar96;
    iVar91 = (1 << ((byte)uVar85 & 0x1f)) >> 1;
    iVar86 = (int)alpha;
    iVar65 = (int)beta;
    iVar95 = (int)gamma;
    iVar83 = 1 << ((bVar45 ^ 0xff) + bVar63 + 7 & 0x1f);
    auVar115 = ZEXT416(uVar76);
    iVar99 = ((1 << (bVar45 & 0x1f)) >> 1) + (1 << (bVar63 + 6 & 0x1f));
    auVar116 = ZEXT416(uVar96);
    iVar93 = (1 << ((bVar63 + 0xe) - bVar45 & 0x1f)) + iVar91;
    iVar88 = (-1 << (bVar44 & 0x1f)) + (-1 << (bVar44 - 1 & 0x1f)) +
             ((1 << ((byte)uVar76 & 0x1f)) >> 1);
    auVar117 = ZEXT416(uVar85);
    iVar91 = (-1 << ((bVar63 + (byte)uVar85) - 1 & 0x1f)) + iVar91;
    auVar101 = pshuflw(ZEXT416(uVar64),ZEXT416(uVar64),0);
    iVar5 = conv_params->fwd_offset;
    iVar6 = conv_params->bck_offset;
    auVar102 = ZEXT416(-1 << (bVar63 & 0x1f) ^ 0xffffffff);
    iVar77 = iVar65 * -3 + 0x10200;
    iVar46 = iVar86 * 7;
    iVar66 = height + -1;
    lVar100 = (long)height;
    auVar102 = pshuflw(auVar102,auVar102,0);
    local_148._0_4_ = auVar102._0_4_;
    local_148._4_4_ = local_148._0_4_;
    local_148._8_4_ = local_148._0_4_;
    local_148._12_4_ = local_148._0_4_;
    iVar50 = iVar86 * 2;
    iVar89 = iVar86 * 4;
    iVar47 = iVar86 * 6;
    iVar48 = iVar86 * 3;
    iVar49 = iVar86 * 5;
    local_2f4 = 0;
    iVar87 = 0;
    iVar81 = p_height;
    do {
      lVar82 = (long)iVar81;
      if (7 < lVar82) {
        lVar82 = 8;
      }
      if (0 < p_width) {
        lVar82 = lVar82 + 7;
        lVar70 = (long)(p_row + 4 + iVar87 << ((byte)subsampling_y & 0x1f));
        iVar78 = p_height - iVar87;
        iVar67 = 8;
        if (iVar78 < 8) {
          iVar67 = iVar78;
        }
        lVar71 = (long)iVar67;
        iVar79 = 0;
        local_2d4 = local_2f4;
        do {
          lVar72 = (long)(p_col + 4 + iVar79 << ((byte)subsampling_x & 0x1f));
          lVar98 = (long)*mat + mat[3] * lVar70 + mat[2] * lVar72 >> ((byte)subsampling_x & 0x3f);
          lVar72 = (long)mat[1] + mat[5] * lVar70 + mat[4] * lVar72 >> ((byte)subsampling_y & 0x3f);
          iVar97 = (int)((ulong)lVar98 >> 0x10);
          iVar92 = (int)((ulong)lVar72 >> 0x10);
          if (iVar97 < -6) {
            if (-7 < iVar78) {
              lVar98 = -7;
              pauVar84 = &local_128;
              do {
                iVar97 = (int)lVar98 + iVar92;
                if (lVar100 <= iVar92 + lVar98) {
                  iVar97 = iVar66;
                }
                if (iVar92 + lVar98 < 0) {
                  iVar97 = 0;
                }
                auVar102 = ZEXT416(((uint)ref[iVar97 * stride] << (7 - bVar45 & 0x1f)) + iVar83);
                auVar102 = pshuflw(auVar102,auVar102,0);
                auVar103._0_4_ = auVar102._0_4_;
                auVar103._4_4_ = auVar103._0_4_;
                auVar103._8_4_ = auVar103._0_4_;
                auVar103._12_4_ = auVar103._0_4_;
                *pauVar84 = auVar103;
                lVar98 = lVar98 + 1;
                pauVar84 = pauVar84 + 1;
              } while (lVar98 < lVar71);
              goto LAB_004109e1;
            }
          }
          else if (iVar97 < width + 6) {
            uVar96 = ((uint)lVar98 & 0xfffc) + (iVar65 + iVar86) * -4 & 0xffffffc0;
            if (width < iVar97 + 9 || iVar97 < 7) {
              if (-7 < iVar78) {
                uVar80 = (iVar97 - width) + 8;
                iVar90 = uVar96 + iVar77;
                lVar98 = -7;
                pauVar84 = &local_128;
                do {
                  iVar68 = iVar92 + (int)lVar98;
                  if (lVar100 <= iVar92 + lVar98) {
                    iVar68 = iVar66;
                  }
                  if (iVar92 + lVar98 < 0) {
                    iVar68 = 0;
                  }
                  auVar102 = pshufb(*(undefined1 (*) [16])
                                     (ref + (long)iVar97 + (long)(iVar68 * stride) + -7),
                                    _DAT_0050da80);
                  auVar131 = pshufb(*(undefined1 (*) [16])
                                     (ref + (long)iVar97 + (long)(iVar68 * stride) + 1),
                                    _DAT_0050da80);
                  auVar211._0_8_ = auVar102._0_8_;
                  auVar211._8_8_ = auVar131._0_8_;
                  auVar104._8_8_ = auVar131._8_8_;
                  auVar104._0_8_ = auVar102._8_8_;
                  if (iVar97 < 7) {
                    auVar211 = pshufb(auVar211,(undefined1  [16])warp_pad_left[6 - iVar97]);
                    auVar104 = pshufb(auVar104,(undefined1  [16])warp_pad_left[6 - iVar97]);
                  }
                  if (-1 < (int)uVar80) {
                    auVar211 = pshufb(auVar211,(undefined1  [16])warp_pad_right[uVar80]);
                    auVar104 = pshufb(auVar104,(undefined1  [16])warp_pad_right[uVar80]);
                  }
                  auVar184._0_14_ = auVar211._0_14_;
                  auVar184[0xe] = auVar211[7];
                  auVar184[0xf] = auVar104[7];
                  auVar183._14_2_ = auVar184._14_2_;
                  auVar183._0_13_ = auVar211._0_13_;
                  auVar183[0xd] = auVar104[6];
                  auVar182._13_3_ = auVar183._13_3_;
                  auVar182._0_12_ = auVar211._0_12_;
                  auVar182[0xc] = auVar211[6];
                  auVar181._12_4_ = auVar182._12_4_;
                  auVar181._0_11_ = auVar211._0_11_;
                  auVar181[0xb] = auVar104[5];
                  auVar180._11_5_ = auVar181._11_5_;
                  auVar180._0_10_ = auVar211._0_10_;
                  auVar180[10] = auVar211[5];
                  auVar179._10_6_ = auVar180._10_6_;
                  auVar179._0_9_ = auVar211._0_9_;
                  auVar179[9] = auVar104[4];
                  auVar178._9_7_ = auVar179._9_7_;
                  auVar178._0_8_ = auVar211._0_8_;
                  auVar178[8] = auVar211[4];
                  auVar177._8_8_ = auVar178._8_8_;
                  auVar177[7] = auVar104[3];
                  auVar177[6] = auVar211[3];
                  auVar177[5] = auVar104[2];
                  auVar177[4] = auVar211[2];
                  auVar177[3] = auVar104[1];
                  auVar177[2] = auVar211[1];
                  auVar177[0] = auVar211[0];
                  auVar177[1] = auVar104[0];
                  auVar212[1] = auVar104[8];
                  auVar212[0] = auVar211[8];
                  auVar212[2] = auVar211[9];
                  auVar212[3] = auVar104[9];
                  auVar212[4] = auVar211[10];
                  auVar212[5] = auVar104[10];
                  auVar212[6] = auVar211[0xb];
                  auVar212[7] = auVar104[0xb];
                  auVar212[8] = auVar211[0xc];
                  auVar212[9] = auVar104[0xc];
                  auVar212[10] = auVar211[0xd];
                  auVar212[0xb] = auVar104[0xd];
                  auVar212[0xc] = auVar211[0xe];
                  auVar212[0xd] = auVar104[0xe];
                  auVar212[0xe] = auVar211[0xf];
                  auVar212[0xf] = auVar104[0xf];
                  aWVar1 = av1_warped_filter[iVar90 >> 10];
                  iVar68 = iVar50 + iVar90 >> 10;
                  aWVar2 = av1_warped_filter[iVar89 + iVar90 >> 10];
                  iVar69 = iVar47 + iVar90 >> 10;
                  auVar134._0_8_ = aWVar1._0_8_;
                  auVar134._8_4_ = aWVar1._4_4_;
                  auVar134._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 2);
                  auVar203._4_4_ = *(undefined4 *)av1_warped_filter[iVar68];
                  auVar203._0_4_ = aWVar1._0_4_;
                  auVar145._0_8_ = aWVar2._0_8_;
                  auVar145._8_4_ = aWVar2._4_4_;
                  auVar145._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 2);
                  auVar203._12_4_ = *(undefined4 *)av1_warped_filter[iVar69];
                  auVar203._8_4_ = aWVar2._0_4_;
                  auVar223._0_8_ =
                       CONCAT44(*(undefined4 *)(av1_warped_filter[iVar68] + 4),aWVar1._8_4_);
                  auVar223._8_4_ = aWVar1._12_4_;
                  auVar223._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 6);
                  auVar118._0_8_ =
                       CONCAT44(*(undefined4 *)(av1_warped_filter[iVar69] + 4),aWVar2._8_4_);
                  auVar118._8_4_ = aWVar2._12_4_;
                  auVar118._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 6);
                  auVar135._8_8_ = auVar145._8_8_;
                  auVar135._0_8_ = auVar134._8_8_;
                  auVar229._8_8_ = auVar118._0_8_;
                  auVar229._0_8_ = auVar223._0_8_;
                  auVar224._8_8_ = auVar118._8_8_;
                  auVar224._0_8_ = auVar223._8_8_;
                  aWVar1 = av1_warped_filter[iVar86 + iVar90 >> 10];
                  iVar68 = iVar48 + iVar90 >> 10;
                  aWVar2 = av1_warped_filter[iVar49 + iVar90 >> 10];
                  iVar69 = iVar46 + iVar90 >> 10;
                  auVar127._0_8_ = aWVar1._0_8_;
                  auVar127._8_4_ = aWVar1._4_4_;
                  auVar127._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 2);
                  auVar146._4_4_ = *(undefined4 *)av1_warped_filter[iVar68];
                  auVar146._0_4_ = aWVar1._0_4_;
                  auVar166._0_8_ = aWVar2._0_8_;
                  auVar166._8_4_ = aWVar2._4_4_;
                  auVar166._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 2);
                  auVar146._12_4_ = *(undefined4 *)av1_warped_filter[iVar69];
                  auVar146._8_4_ = aWVar2._0_4_;
                  auVar105._0_8_ =
                       CONCAT44(*(undefined4 *)(av1_warped_filter[iVar68] + 4),aWVar1._8_4_);
                  auVar105._8_4_ = aWVar1._12_4_;
                  auVar105._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 6);
                  auVar159._0_8_ =
                       CONCAT44(*(undefined4 *)(av1_warped_filter[iVar69] + 4),aWVar2._8_4_);
                  auVar159._8_4_ = aWVar2._12_4_;
                  auVar159._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 6);
                  auVar128._8_8_ = auVar166._8_8_;
                  auVar128._0_8_ = auVar127._8_8_;
                  auVar119._8_8_ = auVar159._0_8_;
                  auVar119._0_8_ = auVar105._0_8_;
                  auVar131 = pmaddwd(auVar203,auVar177);
                  auVar7._16_16_ = auVar212;
                  auVar7._0_16_ = auVar177;
                  in_XMM10 = pmaddwd(auVar7._4_16_,auVar135);
                  auVar8._16_16_ = auVar212;
                  auVar8._0_16_ = auVar177;
                  auVar102 = pmaddwd(auVar8._8_16_,auVar229);
                  auVar9._16_16_ = auVar212;
                  auVar9._0_16_ = auVar177;
                  auVar138 = pmaddwd(auVar9._12_16_,auVar224);
                  auVar204._0_4_ =
                       auVar131._0_4_ + iVar99 + in_XMM10._0_4_ + auVar138._0_4_ + auVar102._0_4_ >>
                       auVar116;
                  auVar204._4_4_ =
                       auVar131._4_4_ + iVar99 + in_XMM10._4_4_ + auVar138._4_4_ + auVar102._4_4_ >>
                       auVar116;
                  auVar204._8_4_ =
                       auVar131._8_4_ + iVar99 + in_XMM10._8_4_ + auVar138._8_4_ + auVar102._8_4_ >>
                       auVar116;
                  auVar204._12_4_ =
                       auVar131._12_4_ + iVar99 + in_XMM10._12_4_ +
                       auVar138._12_4_ + auVar102._12_4_ >> auVar116;
                  auVar106._8_8_ = auVar159._8_8_;
                  auVar106._0_8_ = auVar105._8_8_;
                  auVar10._16_16_ = auVar212;
                  auVar10._0_16_ = auVar177;
                  auVar131 = pmaddwd(auVar10._2_16_,auVar146);
                  auVar11._16_16_ = auVar212;
                  auVar11._0_16_ = auVar177;
                  auVar138 = pmaddwd(auVar11._6_16_,auVar128);
                  auVar12._16_16_ = auVar212;
                  auVar12._0_16_ = auVar177;
                  auVar102 = pmaddwd(auVar12._10_16_,auVar119);
                  auVar13._16_16_ = auVar212;
                  auVar13._0_16_ = auVar177;
                  auVar154 = pmaddwd(auVar13._14_16_,auVar106);
                  auVar136._0_4_ =
                       auVar131._0_4_ + iVar99 + auVar102._0_4_ + auVar138._0_4_ + auVar154._0_4_ >>
                       auVar116;
                  auVar136._4_4_ =
                       auVar131._4_4_ + iVar99 + auVar102._4_4_ + auVar138._4_4_ + auVar154._4_4_ >>
                       auVar116;
                  auVar136._8_4_ =
                       auVar131._8_4_ + iVar99 + auVar102._8_4_ + auVar138._8_4_ + auVar154._8_4_ >>
                       auVar116;
                  auVar136._12_4_ =
                       auVar131._12_4_ + iVar99 + auVar102._12_4_ + auVar138._12_4_ +
                       auVar154._12_4_ >> auVar116;
                  auVar102 = packssdw(auVar204,auVar136);
                  *pauVar84 = auVar102;
                  lVar98 = lVar98 + 1;
                  iVar90 = iVar90 + iVar65;
                  pauVar84 = pauVar84 + 1;
                } while (lVar98 < lVar71);
                goto LAB_004109e1;
              }
            }
            else {
              uVar80 = uVar96 + 0x10200;
              if (beta == 0 && alpha == 0) {
                if (-7 < iVar78) {
                  uVar75 = (ulong)(uVar80 >> 6 & 0xfffffff0);
                  uVar51 = *(undefined4 *)((long)av1_warped_filter[0] + uVar75);
                  uVar52 = *(undefined4 *)((long)av1_warped_filter[0] + uVar75 + 4);
                  uVar53 = *(undefined4 *)((long)av1_warped_filter[0] + uVar75 + 8);
                  uVar54 = *(undefined4 *)((long)av1_warped_filter[0] + uVar75 + 0xc);
                  auVar131._4_4_ = uVar51;
                  auVar131._0_4_ = uVar51;
                  auVar131._8_4_ = uVar51;
                  auVar131._12_4_ = uVar51;
                  auVar138._4_4_ = uVar52;
                  auVar138._0_4_ = uVar52;
                  auVar138._8_4_ = uVar52;
                  auVar138._12_4_ = uVar52;
                  auVar154._4_4_ = uVar53;
                  auVar154._0_4_ = uVar53;
                  auVar154._8_4_ = uVar53;
                  auVar154._12_4_ = uVar53;
                  auVar122._4_4_ = uVar54;
                  auVar122._0_4_ = uVar54;
                  auVar122._8_4_ = uVar54;
                  auVar122._12_4_ = uVar54;
                  lVar74 = (long)iVar92 + -7;
                  pauVar84 = &local_128;
                  lVar98 = lVar82;
                  do {
                    iVar92 = iVar66;
                    if (lVar74 < lVar100) {
                      iVar92 = (int)lVar74;
                    }
                    if (lVar74 < 0) {
                      iVar92 = 0;
                    }
                    auVar102 = *(undefined1 (*) [16])
                                ((long)ref +
                                (long)(iVar92 * stride) * 2 + ((ulong)(uint)(iVar97 * 2) - 0xe));
                    auVar161 = *(undefined1 (*) [16])
                                ((long)ref +
                                (long)(iVar92 * stride) * 2 + (ulong)(uint)(iVar97 * 2) + 2);
                    auVar21._16_16_ = auVar161;
                    auVar21._0_16_ = auVar102;
                    auVar22._16_16_ = auVar161;
                    auVar22._0_16_ = auVar102;
                    auVar163 = pmaddwd(auVar22._8_16_,auVar154);
                    auVar23._16_16_ = auVar161;
                    auVar23._0_16_ = auVar102;
                    auVar155 = pmaddwd(auVar23._12_16_,auVar122);
                    auVar24._16_16_ = auVar161;
                    auVar24._0_16_ = auVar102;
                    auVar25._16_16_ = auVar161;
                    auVar25._0_16_ = auVar102;
                    auVar26._16_16_ = auVar161;
                    auVar26._0_16_ = auVar102;
                    auVar235 = pmaddwd(auVar102,auVar131);
                    auVar215 = pmaddwd(auVar21._4_16_,auVar138);
                    auVar236._0_4_ =
                         auVar235._0_4_ + iVar99 + auVar215._0_4_ + auVar155._0_4_ + auVar163._0_4_
                         >> auVar116;
                    auVar236._4_4_ =
                         auVar235._4_4_ + iVar99 + auVar215._4_4_ + auVar155._4_4_ + auVar163._4_4_
                         >> auVar116;
                    auVar236._8_4_ =
                         auVar235._8_4_ + iVar99 + auVar215._8_4_ + auVar155._8_4_ + auVar163._8_4_
                         >> auVar116;
                    auVar236._12_4_ =
                         auVar235._12_4_ + iVar99 + auVar215._12_4_ +
                         auVar155._12_4_ + auVar163._12_4_ >> auVar116;
                    auVar27._16_16_ = auVar161;
                    auVar27._0_16_ = auVar102;
                    auVar102 = pmaddwd(auVar24._2_16_,auVar131);
                    auVar161 = pmaddwd(auVar25._6_16_,auVar138);
                    auVar163 = pmaddwd(auVar26._10_16_,auVar154);
                    in_XMM10._0_4_ = auVar163._0_4_ + auVar161._0_4_;
                    in_XMM10._4_4_ = auVar163._4_4_ + auVar161._4_4_;
                    in_XMM10._8_4_ = auVar163._8_4_ + auVar161._8_4_;
                    in_XMM10._12_4_ = auVar163._12_4_ + auVar161._12_4_;
                    auVar163 = pmaddwd(auVar27._14_16_,auVar122);
                    auVar161._0_4_ =
                         auVar102._0_4_ + iVar99 + in_XMM10._0_4_ + auVar163._0_4_ >> auVar116;
                    auVar161._4_4_ =
                         auVar102._4_4_ + iVar99 + in_XMM10._4_4_ + auVar163._4_4_ >> auVar116;
                    auVar161._8_4_ =
                         auVar102._8_4_ + iVar99 + in_XMM10._8_4_ + auVar163._8_4_ >> auVar116;
                    auVar161._12_4_ =
                         auVar102._12_4_ + iVar99 + in_XMM10._12_4_ + auVar163._12_4_ >> auVar116;
                    auVar102 = packssdw(auVar236,auVar161);
                    *pauVar84 = auVar102;
                    pauVar84 = pauVar84 + 1;
                    lVar74 = lVar74 + 1;
                    lVar98 = lVar98 + -1;
                  } while (lVar98 != 0);
                  goto LAB_004109e1;
                }
              }
              else if (alpha != 0 || beta == 0) {
                if (alpha != 0 && beta == 0) {
                  if (-7 < iVar78) {
                    iVar90 = (int)(iVar86 + uVar80) >> 10;
                    uVar51 = *(undefined4 *)av1_warped_filter[iVar90];
                    uVar52 = *(undefined4 *)(av1_warped_filter[iVar90] + 4);
                    aWVar1 = av1_warped_filter[(int)(iVar48 + uVar80) >> 10];
                    iVar68 = (int)(iVar49 + uVar80) >> 10;
                    uVar54 = *(undefined4 *)(av1_warped_filter[iVar68] + 4);
                    iVar69 = (int)(iVar46 + uVar80) >> 10;
                    uVar53 = *(undefined4 *)(av1_warped_filter[iVar69] + 4);
                    auVar42._4_8_ = in_XMM10._8_8_;
                    auVar42._0_4_ = aWVar1._8_4_;
                    auVar172._0_8_ = auVar42._0_8_ << 0x20;
                    auVar172._8_4_ = *(undefined4 *)(av1_warped_filter[iVar90] + 6);
                    auVar172._12_4_ = aWVar1._12_4_;
                    auVar57._12_4_ = *(undefined4 *)av1_warped_filter[iVar69];
                    auVar57._8_4_ = *(undefined4 *)av1_warped_filter[iVar68];
                    auVar43._4_8_ = aWVar1._8_8_;
                    auVar43._0_4_ = aWVar1._0_4_;
                    auVar113._0_8_ = auVar43._0_8_ << 0x20;
                    auVar113._8_4_ = *(undefined4 *)(av1_warped_filter[iVar90] + 2);
                    auVar113._12_4_ = aWVar1._4_4_;
                    local_148._4_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 2);
                    local_148._0_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 2);
                    aWVar2 = av1_warped_filter[(int)uVar80 >> 10];
                    iVar68 = (int)(iVar50 + uVar80) >> 10;
                    auVar191._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar68] + 4),aWVar2._8_4_);
                    auVar191._8_4_ = aWVar2._12_4_;
                    auVar191._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 6);
                    aWVar3 = av1_warped_filter[(int)(iVar89 + uVar80) >> 10];
                    iVar90 = (int)(uVar80 + iVar47) >> 10;
                    auVar140._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar90] + 4),aWVar3._8_4_);
                    auVar140._8_4_ = aWVar3._12_4_;
                    auVar140._12_4_ = *(undefined4 *)(av1_warped_filter[iVar90] + 6);
                    auVar207._8_8_ = auVar140._8_8_;
                    auVar207._0_8_ = auVar191._8_8_;
                    auVar192._8_8_ = auVar140._0_8_;
                    auVar192._0_8_ = auVar191._0_8_;
                    auVar237._0_8_ = aWVar2._0_8_;
                    auVar237._8_4_ = aWVar2._4_4_;
                    auVar237._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 2);
                    auVar238._0_4_ = aWVar2._0_4_;
                    auVar238._4_4_ = *(undefined4 *)av1_warped_filter[iVar68];
                    auVar126._0_8_ = aWVar3._0_8_;
                    auVar126._8_4_ = aWVar3._4_4_;
                    auVar126._12_4_ = *(undefined4 *)(av1_warped_filter[iVar90] + 2);
                    auVar238._12_4_ = *(undefined4 *)av1_warped_filter[iVar90];
                    auVar238._8_4_ = aWVar3._0_4_;
                    auVar226._8_8_ = auVar126._8_8_;
                    auVar226._0_8_ = auVar237._8_8_;
                    lVar74 = (long)iVar92 + -7;
                    pauVar84 = &local_128;
                    lVar98 = lVar82;
                    do {
                      iVar92 = iVar66;
                      if (lVar74 < lVar100) {
                        iVar92 = (int)lVar74;
                      }
                      if (lVar74 < 0) {
                        iVar92 = 0;
                      }
                      auVar102 = *(undefined1 (*) [16])
                                  ((long)ref +
                                  (long)(iVar92 * stride) * 2 + ((ulong)(uint)(iVar97 * 2) - 0xe));
                      auVar131 = *(undefined1 (*) [16])
                                  ((long)ref +
                                  (long)(iVar92 * stride) * 2 + (ulong)(uint)(iVar97 * 2) + 2);
                      auVar28._16_16_ = auVar131;
                      auVar28._0_16_ = auVar102;
                      auVar29._16_16_ = auVar131;
                      auVar29._0_16_ = auVar102;
                      auVar138 = pmaddwd(auVar29._8_16_,auVar192);
                      auVar30._16_16_ = auVar131;
                      auVar30._0_16_ = auVar102;
                      auVar161 = pmaddwd(auVar30._12_16_,auVar207);
                      auVar31._16_16_ = auVar131;
                      auVar31._0_16_ = auVar102;
                      auVar32._16_16_ = auVar131;
                      auVar32._0_16_ = auVar102;
                      auVar33._16_16_ = auVar131;
                      auVar33._0_16_ = auVar102;
                      auVar122 = pmaddwd(auVar102,auVar238);
                      auVar154 = pmaddwd(auVar28._4_16_,auVar226);
                      auVar141._0_4_ =
                           auVar122._0_4_ + iVar99 + auVar154._0_4_ +
                           auVar161._0_4_ + auVar138._0_4_ >> auVar116;
                      auVar141._4_4_ =
                           auVar122._4_4_ + iVar99 + auVar154._4_4_ +
                           auVar161._4_4_ + auVar138._4_4_ >> auVar116;
                      auVar141._8_4_ =
                           auVar122._8_4_ + iVar99 + auVar154._8_4_ +
                           auVar161._8_4_ + auVar138._8_4_ >> auVar116;
                      auVar141._12_4_ =
                           auVar122._12_4_ + iVar99 + auVar154._12_4_ +
                           auVar161._12_4_ + auVar138._12_4_ >> auVar116;
                      auVar34._16_16_ = auVar131;
                      auVar34._0_16_ = auVar102;
                      auVar57._4_4_ = aWVar1._0_4_;
                      auVar57._0_4_ = uVar51;
                      auVar102 = pmaddwd(auVar31._2_16_,auVar57);
                      auVar62._8_8_ = uStack_150;
                      auVar62._0_8_ = auVar113._8_8_;
                      auVar131 = pmaddwd(auVar32._6_16_,auVar62);
                      auVar56._4_4_ = aWVar1._8_4_;
                      auVar56._0_4_ = uVar52;
                      auVar56._8_4_ = uVar54;
                      auVar56._12_4_ = uVar53;
                      auVar138 = pmaddwd(auVar33._10_16_,auVar56);
                      in_XMM10._0_4_ = auVar138._0_4_ + auVar131._0_4_;
                      in_XMM10._4_4_ = auVar138._4_4_ + auVar131._4_4_;
                      in_XMM10._8_4_ = auVar138._8_4_ + auVar131._8_4_;
                      in_XMM10._12_4_ = auVar138._12_4_ + auVar131._12_4_;
                      auVar55._8_8_ = uStack_230;
                      auVar55._0_8_ = auVar172._8_8_;
                      auVar131 = pmaddwd(auVar34._14_16_,auVar55);
                      auVar114._0_4_ =
                           auVar102._0_4_ + iVar99 + in_XMM10._0_4_ + auVar131._0_4_ >> auVar116;
                      auVar114._4_4_ =
                           auVar102._4_4_ + iVar99 + in_XMM10._4_4_ + auVar131._4_4_ >> auVar116;
                      auVar114._8_4_ =
                           auVar102._8_4_ + iVar99 + in_XMM10._8_4_ + auVar131._8_4_ >> auVar116;
                      auVar114._12_4_ =
                           auVar102._12_4_ + iVar99 + in_XMM10._12_4_ + auVar131._12_4_ >> auVar116;
                      auVar102 = packssdw(auVar141,auVar114);
                      *pauVar84 = auVar102;
                      pauVar84 = pauVar84 + 1;
                      lVar74 = lVar74 + 1;
                      lVar98 = lVar98 + -1;
                    } while (lVar98 != 0);
LAB_004109e1:
                    if (0 < iVar78) {
                      iVar90 = (((uint)lVar72 & 0xfffc) + (delta + iVar95) * -4 & 0xffffffc0) +
                               0x10200;
                      lVar72 = -4;
                      puVar94 = local_b8;
                      iVar97 = local_2d4;
                      iVar92 = iVar87;
                      do {
                        auVar102 = *(undefined1 (*) [16])(puVar94 + -0x38);
                        auVar131 = *(undefined1 (*) [16])(puVar94 + -0x28);
                        auVar170._0_12_ = auVar102._0_12_;
                        auVar170._12_2_ = auVar102._6_2_;
                        auVar170._14_2_ = puVar94[-0x2d];
                        auVar169._12_4_ = auVar170._12_4_;
                        auVar169._0_10_ = auVar102._0_10_;
                        auVar169._10_2_ = puVar94[-0x2e];
                        auVar168._10_6_ = auVar169._10_6_;
                        auVar168._0_8_ = auVar102._0_8_;
                        auVar168._8_2_ = auVar102._4_2_;
                        auVar167._8_8_ = auVar168._8_8_;
                        auVar167._6_2_ = puVar94[-0x2f];
                        auVar167._4_2_ = auVar102._2_2_;
                        auVar167._0_2_ = auVar102._0_2_;
                        auVar167._2_2_ = puVar94[-0x30];
                        auVar233._0_12_ = auVar131._0_12_;
                        auVar233._12_2_ = auVar131._6_2_;
                        auVar233._14_2_ = puVar94[-0x1d];
                        auVar232._12_4_ = auVar233._12_4_;
                        auVar232._0_10_ = auVar131._0_10_;
                        auVar232._10_2_ = puVar94[-0x1e];
                        auVar231._10_6_ = auVar232._10_6_;
                        auVar231._0_8_ = auVar131._0_8_;
                        auVar231._8_2_ = auVar131._4_2_;
                        auVar230._8_8_ = auVar231._8_8_;
                        auVar230._6_2_ = puVar94[-0x1f];
                        auVar230._4_2_ = auVar131._2_2_;
                        auVar230._0_2_ = auVar131._0_2_;
                        auVar230._2_2_ = puVar94[-0x20];
                        auVar138 = *(undefined1 (*) [16])(puVar94 + -0x18);
                        aWVar1 = av1_warped_filter[iVar90 >> 10];
                        iVar68 = iVar95 * 2 + iVar90 >> 10;
                        aWVar2 = av1_warped_filter[iVar95 * 4 + iVar90 >> 10];
                        iVar69 = iVar95 * 6 + iVar90 >> 10;
                        auVar120._0_8_ = aWVar1._0_8_;
                        auVar120._8_4_ = aWVar1._4_4_;
                        auVar120._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 2);
                        auVar160._4_4_ = *(undefined4 *)av1_warped_filter[iVar68];
                        auVar160._0_4_ = aWVar1._0_4_;
                        auVar213._0_8_ =
                             CONCAT44(*(undefined4 *)(av1_warped_filter[iVar68] + 4),aWVar1._8_4_);
                        auVar213._8_4_ = aWVar1._12_4_;
                        auVar213._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 6);
                        auVar147._0_8_ = aWVar2._0_8_;
                        auVar147._8_4_ = aWVar2._4_4_;
                        auVar147._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 2);
                        auVar160._12_4_ = *(undefined4 *)av1_warped_filter[iVar69];
                        auVar160._8_4_ = aWVar2._0_4_;
                        auVar107._0_8_ =
                             CONCAT44(*(undefined4 *)(av1_warped_filter[iVar69] + 4),aWVar2._8_4_);
                        auVar107._8_4_ = aWVar2._12_4_;
                        auVar107._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 6);
                        auVar161 = pmaddwd(auVar160,auVar167);
                        in_XMM10 = *(undefined1 (*) [16])(puVar94 + -0x10);
                        auVar121._8_8_ = auVar147._8_8_;
                        auVar121._0_8_ = auVar120._8_8_;
                        auVar151._0_12_ = auVar138._0_12_;
                        auVar151._12_2_ = auVar138._6_2_;
                        auVar151._14_2_ = in_XMM10._6_2_;
                        auVar150._12_4_ = auVar151._12_4_;
                        auVar150._0_10_ = auVar138._0_10_;
                        auVar150._10_2_ = in_XMM10._4_2_;
                        auVar149._10_6_ = auVar150._10_6_;
                        auVar149._0_8_ = auVar138._0_8_;
                        auVar149._8_2_ = auVar138._4_2_;
                        auVar148._8_8_ = auVar149._8_8_;
                        auVar148._6_2_ = in_XMM10._2_2_;
                        auVar148._4_2_ = auVar138._2_2_;
                        auVar148._0_2_ = auVar138._0_2_;
                        auVar148._2_2_ = in_XMM10._0_2_;
                        auVar122 = pmaddwd(auVar121,auVar230);
                        auVar154 = *(undefined1 (*) [16])(puVar94 + -8);
                        auVar162._8_8_ = auVar107._0_8_;
                        auVar162._0_8_ = auVar213._0_8_;
                        auVar163 = pmaddwd(auVar162,auVar148);
                        auVar214._8_8_ = auVar107._8_8_;
                        auVar214._0_8_ = auVar213._8_8_;
                        auVar111._0_12_ = auVar154._0_12_;
                        auVar111._12_2_ = auVar154._6_2_;
                        auVar111._14_2_ = puVar94[3];
                        auVar110._12_4_ = auVar111._12_4_;
                        auVar110._0_10_ = auVar154._0_10_;
                        auVar110._10_2_ = puVar94[2];
                        auVar109._10_6_ = auVar110._10_6_;
                        auVar109._0_8_ = auVar154._0_8_;
                        auVar109._8_2_ = auVar154._4_2_;
                        auVar108._8_8_ = auVar109._8_8_;
                        auVar108._6_2_ = puVar94[1];
                        auVar108._4_2_ = auVar154._2_2_;
                        auVar108._0_2_ = auVar154._0_2_;
                        auVar108._2_2_ = *puVar94;
                        auVar215 = pmaddwd(auVar214,auVar108);
                        iVar210 = auVar215._0_4_ + auVar163._0_4_ + auVar122._0_4_ + auVar161._0_4_;
                        iVar220 = auVar215._4_4_ + auVar163._4_4_ + auVar122._4_4_ + auVar161._4_4_;
                        iVar221 = auVar215._8_4_ + auVar163._8_4_ + auVar122._8_4_ + auVar161._8_4_;
                        iVar222 = auVar215._12_4_ + auVar163._12_4_ +
                                  auVar122._12_4_ + auVar161._12_4_;
                        auVar205._2_2_ = puVar94[-0x2c];
                        auVar205._0_2_ = auVar102._8_2_;
                        auVar205._4_2_ = auVar102._10_2_;
                        auVar205._6_2_ = puVar94[-0x2b];
                        auVar205._8_2_ = auVar102._12_2_;
                        auVar205._10_2_ = puVar94[-0x2a];
                        auVar205._12_2_ = auVar102._14_2_;
                        auVar205._14_2_ = puVar94[-0x29];
                        auVar185._2_2_ = puVar94[-0x1c];
                        auVar185._0_2_ = auVar131._8_2_;
                        auVar185._4_2_ = auVar131._10_2_;
                        auVar185._6_2_ = puVar94[-0x1b];
                        auVar185._8_2_ = auVar131._12_2_;
                        auVar185._10_2_ = puVar94[-0x1a];
                        auVar185._12_2_ = auVar131._14_2_;
                        auVar185._14_2_ = puVar94[-0x19];
                        auVar225._2_2_ = in_XMM10._8_2_;
                        auVar225._0_2_ = auVar138._8_2_;
                        auVar225._4_2_ = auVar138._10_2_;
                        auVar225._6_2_ = in_XMM10._10_2_;
                        auVar225._8_2_ = auVar138._12_2_;
                        auVar225._10_2_ = in_XMM10._12_2_;
                        auVar225._12_2_ = auVar138._14_2_;
                        auVar225._14_2_ = in_XMM10._14_2_;
                        auVar234._2_2_ = puVar94[4];
                        auVar234._0_2_ = auVar154._8_2_;
                        auVar234._4_2_ = auVar154._10_2_;
                        auVar234._6_2_ = puVar94[5];
                        auVar234._8_2_ = auVar154._12_2_;
                        auVar234._10_2_ = puVar94[6];
                        auVar234._12_2_ = auVar154._14_2_;
                        auVar234._14_2_ = puVar94[7];
                        aWVar1 = av1_warped_filter[iVar95 + iVar90 >> 10];
                        iVar68 = iVar95 * 3 + iVar90 >> 10;
                        aWVar2 = av1_warped_filter[iVar95 * 5 + iVar90 >> 10];
                        iVar69 = iVar95 * 7 + iVar90 >> 10;
                        auVar152._0_8_ = aWVar1._0_8_;
                        auVar152._8_4_ = aWVar1._4_4_;
                        auVar152._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 2);
                        auVar137._4_4_ = *(undefined4 *)av1_warped_filter[iVar68];
                        auVar137._0_4_ = aWVar1._0_4_;
                        auVar129._0_8_ =
                             CONCAT44(*(undefined4 *)(av1_warped_filter[iVar68] + 4),aWVar1._8_4_);
                        auVar129._8_4_ = aWVar1._12_4_;
                        auVar129._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 6);
                        auVar123._0_8_ = aWVar2._0_8_;
                        auVar123._8_4_ = aWVar2._4_4_;
                        auVar123._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 2);
                        auVar137._12_4_ = *(undefined4 *)av1_warped_filter[iVar69];
                        auVar137._8_4_ = aWVar2._0_4_;
                        auVar112._0_8_ =
                             CONCAT44(*(undefined4 *)(av1_warped_filter[iVar69] + 4),aWVar2._8_4_);
                        auVar112._8_4_ = aWVar2._12_4_;
                        auVar112._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 6);
                        auVar138 = pmaddwd(auVar137,auVar205);
                        auVar153._8_8_ = auVar123._8_8_;
                        auVar153._0_8_ = auVar152._8_8_;
                        auVar154 = pmaddwd(auVar153,auVar185);
                        auVar124._8_8_ = auVar112._0_8_;
                        auVar124._0_8_ = auVar129._0_8_;
                        auVar102 = pmaddwd(auVar124,auVar225);
                        auVar130._8_8_ = auVar112._8_8_;
                        auVar130._0_8_ = auVar129._8_8_;
                        auVar131 = pmaddwd(auVar130,auVar234);
                        iVar68 = auVar131._0_4_ + auVar102._0_4_ + auVar154._0_4_ + auVar138._0_4_;
                        iVar69 = auVar131._4_4_ + auVar102._4_4_ + auVar154._4_4_ + auVar138._4_4_;
                        iVar132 = auVar131._8_4_ + auVar102._8_4_ + auVar154._8_4_ + auVar138._8_4_;
                        iVar133 = auVar131._12_4_ + auVar102._12_4_ +
                                  auVar154._12_4_ + auVar138._12_4_;
                        if (conv_params->is_compound == 0) {
                          auVar187._0_4_ = iVar210 + iVar91 >> auVar117;
                          auVar187._4_4_ = iVar68 + iVar91 >> auVar117;
                          auVar187._8_4_ = iVar220 + iVar91 >> auVar117;
                          auVar187._12_4_ = iVar69 + iVar91 >> auVar117;
                          auVar216._0_4_ = iVar221 + iVar91 >> auVar117;
                          auVar216._4_4_ = iVar132 + iVar91 >> auVar117;
                          auVar216._8_4_ = iVar222 + iVar91 >> auVar117;
                          auVar216._12_4_ = iVar133 + iVar91 >> auVar117;
                          auVar102 = packssdw(auVar187,auVar216);
                          sVar175 = auVar102._0_2_;
                          uVar174 = (ushort)((short)local_148._0_2_ < sVar175) * local_148._0_2_ |
                                    (ushort)((short)local_148._0_2_ >= sVar175) * sVar175;
                          sVar175 = auVar102._2_2_;
                          uVar193 = (ushort)((short)local_148._2_2_ < sVar175) * local_148._2_2_ |
                                    (ushort)((short)local_148._2_2_ >= sVar175) * sVar175;
                          sVar175 = auVar102._4_2_;
                          uVar195 = (ushort)((short)local_148._4_2_ < sVar175) * local_148._4_2_ |
                                    (ushort)((short)local_148._4_2_ >= sVar175) * sVar175;
                          sVar175 = auVar102._6_2_;
                          uVar197 = (ushort)((short)local_148._6_2_ < sVar175) * local_148._6_2_ |
                                    (ushort)((short)local_148._6_2_ >= sVar175) * sVar175;
                          sVar175 = auVar102._8_2_;
                          uVar199 = (ushort)((short)local_148._8_2_ < sVar175) * local_148._8_2_ |
                                    (ushort)((short)local_148._8_2_ >= sVar175) * sVar175;
                          sVar175 = auVar102._10_2_;
                          uVar200 = (ushort)((short)local_148._10_2_ < sVar175) * local_148._10_2_ |
                                    (ushort)((short)local_148._10_2_ >= sVar175) * sVar175;
                          sVar175 = auVar102._12_2_;
                          sVar194 = auVar102._14_2_;
                          uVar201 = (ushort)((short)local_148._12_2_ < sVar175) * local_148._12_2_ |
                                    (ushort)((short)local_148._12_2_ >= sVar175) * sVar175;
                          uVar202 = (ushort)((short)local_148._14_2_ < sVar194) * local_148._14_2_ |
                                    (ushort)((short)local_148._14_2_ >= sVar194) * sVar194;
                          auVar188._0_8_ =
                               CONCAT26((-1 < (short)uVar197) * uVar197,
                                        CONCAT24((-1 < (short)uVar195) * uVar195,
                                                 CONCAT22((-1 < (short)uVar193) * uVar193,
                                                          (-1 < (short)uVar174) * uVar174)));
                          auVar188._8_2_ = (-1 < (short)uVar199) * uVar199;
                          auVar188._10_2_ = (-1 < (short)uVar200) * uVar200;
                          auVar188._12_2_ = (-1 < (short)uVar201) * uVar201;
                          auVar188._14_2_ = (-1 < (short)uVar202) * uVar202;
                          if (p_width == 4) {
                            *(undefined8 *)(pred + iVar97) = auVar188._0_8_;
                          }
                          else {
                            *(undefined1 (*) [16])(pred + iVar97) = auVar188;
                          }
                        }
                        else {
                          auVar186._0_4_ = iVar210 + iVar93 >> auVar117;
                          auVar186._4_4_ = iVar68 + iVar93 >> auVar117;
                          auVar186._8_4_ = iVar220 + iVar93 >> auVar117;
                          auVar186._12_4_ = iVar69 + iVar93 >> auVar117;
                          puVar73 = conv_params->dst + (conv_params->dst_stride * iVar92 + iVar79);
                          local_178 = auVar101._0_2_;
                          sStack_176 = auVar101._2_2_;
                          if (conv_params->do_average == 0) {
                            auVar102 = packusdw(auVar186,auVar186);
                            uVar176 = auVar102._0_8_;
                          }
                          else {
                            auVar112 = pmovzxwd(auVar112,*(undefined8 *)puVar73);
                            if (conv_params->use_dist_wtd_comp_avg == 0) {
                              iVar68 = auVar186._0_4_ + auVar112._0_4_ >> 1;
                              iVar69 = auVar186._4_4_ + auVar112._4_4_ >> 1;
                              iVar210 = auVar186._8_4_ + auVar112._8_4_ >> 1;
                              iVar220 = auVar186._12_4_ + auVar112._12_4_ >> 1;
                            }
                            else {
                              auVar60._4_4_ = iVar5;
                              auVar60._0_4_ = iVar5;
                              auVar60._8_4_ = iVar5;
                              auVar60._12_4_ = iVar5;
                              auVar112 = pmulld(auVar112,auVar60);
                              auVar58._4_4_ = iVar6;
                              auVar58._0_4_ = iVar6;
                              auVar58._8_4_ = iVar6;
                              auVar58._12_4_ = iVar6;
                              auVar102 = pmulld(auVar186,auVar58);
                              iVar68 = auVar102._0_4_ + auVar112._0_4_ >> 4;
                              iVar69 = auVar102._4_4_ + auVar112._4_4_ >> 4;
                              iVar210 = auVar102._8_4_ + auVar112._8_4_ >> 4;
                              iVar220 = auVar102._12_4_ + auVar112._12_4_ >> 4;
                            }
                            puVar73 = pred + iVar97;
                            auVar189._0_4_ = iVar68 + iVar88 >> auVar115;
                            auVar189._4_4_ = iVar69 + iVar88 >> auVar115;
                            auVar189._8_4_ = iVar210 + iVar88 >> auVar115;
                            auVar189._12_4_ = iVar220 + iVar88 >> auVar115;
                            auVar102 = packusdw(auVar189,auVar189);
                            sVar175 = auVar102._0_2_;
                            sVar194 = auVar102._2_2_;
                            sVar196 = auVar102._4_2_;
                            sVar198 = auVar102._6_2_;
                            uVar176 = CONCAT26((ushort)(sStack_176 < sVar198) * sStack_176 |
                                               (ushort)(sStack_176 >= sVar198) * sVar198,
                                               CONCAT24((ushort)(local_178 < sVar196) * local_178 |
                                                        (ushort)(local_178 >= sVar196) * sVar196,
                                                        CONCAT22((ushort)(sStack_176 < sVar194) *
                                                                 sStack_176 |
                                                                 (ushort)(sStack_176 >= sVar194) *
                                                                 sVar194,(ushort)(local_178 <
                                                                                 sVar175) *
                                                                         local_178 |
                                                                         (ushort)(local_178 >=
                                                                                 sVar175) * sVar175)
                                                       ));
                          }
                          *(undefined8 *)puVar73 = uVar176;
                          if (4 < p_width) {
                            lVar98 = (long)(conv_params->dst_stride * iVar92 + iVar79);
                            auVar217._0_4_ = iVar221 + iVar93 >> auVar117;
                            auVar217._4_4_ = iVar132 + iVar93 >> auVar117;
                            auVar217._8_4_ = iVar222 + iVar93 >> auVar117;
                            auVar217._12_4_ = iVar133 + iVar93 >> auVar117;
                            if (conv_params->do_average == 0) {
                              auVar102 = packusdw(auVar217,auVar217);
                              *(long *)(conv_params->dst + lVar98 + 4) = auVar102._0_8_;
                            }
                            else {
                              auVar102 = pmovzxwd(auVar112,*(undefined8 *)
                                                            (conv_params->dst + lVar98 + 4));
                              if (conv_params->use_dist_wtd_comp_avg == 0) {
                                iVar68 = auVar217._0_4_ + auVar102._0_4_ >> 1;
                                iVar69 = auVar217._4_4_ + auVar102._4_4_ >> 1;
                                iVar132 = auVar217._8_4_ + auVar102._8_4_ >> 1;
                                iVar133 = auVar217._12_4_ + auVar102._12_4_ >> 1;
                              }
                              else {
                                auVar61._4_4_ = iVar5;
                                auVar61._0_4_ = iVar5;
                                auVar61._8_4_ = iVar5;
                                auVar61._12_4_ = iVar5;
                                auVar102 = pmulld(auVar102,auVar61);
                                auVar59._4_4_ = iVar6;
                                auVar59._0_4_ = iVar6;
                                auVar59._8_4_ = iVar6;
                                auVar59._12_4_ = iVar6;
                                auVar131 = pmulld(auVar217,auVar59);
                                iVar68 = auVar131._0_4_ + auVar102._0_4_ >> 4;
                                iVar69 = auVar131._4_4_ + auVar102._4_4_ >> 4;
                                iVar132 = auVar131._8_4_ + auVar102._8_4_ >> 4;
                                iVar133 = auVar131._12_4_ + auVar102._12_4_ >> 4;
                              }
                              auVar218._0_4_ = iVar68 + iVar88 >> auVar115;
                              auVar218._4_4_ = iVar69 + iVar88 >> auVar115;
                              auVar218._8_4_ = iVar132 + iVar88 >> auVar115;
                              auVar218._12_4_ = iVar133 + iVar88 >> auVar115;
                              auVar102 = packusdw(auVar218,auVar218);
                              sVar175 = auVar102._0_2_;
                              sVar194 = auVar102._2_2_;
                              sVar196 = auVar102._4_2_;
                              sVar198 = auVar102._6_2_;
                              *(ulong *)(pred + (long)iVar97 + 4) =
                                   CONCAT26((ushort)(sStack_176 < sVar198) * sStack_176 |
                                            (ushort)(sStack_176 >= sVar198) * sVar198,
                                            CONCAT24((ushort)(local_178 < sVar196) * local_178 |
                                                     (ushort)(local_178 >= sVar196) * sVar196,
                                                     CONCAT22((ushort)(sStack_176 < sVar194) *
                                                              sStack_176 |
                                                              (ushort)(sStack_176 >= sVar194) *
                                                              sVar194,(ushort)(local_178 < sVar175)
                                                                      * local_178 |
                                                                      (ushort)(local_178 >= sVar175)
                                                                      * sVar175)));
                            }
                          }
                        }
                        lVar72 = lVar72 + 1;
                        puVar94 = puVar94 + 8;
                        iVar90 = iVar90 + delta;
                        iVar97 = iVar97 + p_stride;
                        iVar92 = iVar92 + 1;
                      } while (lVar72 < iVar67 + -4);
                    }
                  }
                }
                else if (-7 < iVar78) {
                  iVar90 = uVar96 + iVar77;
                  lVar74 = (long)iVar92 + -7;
                  pauVar84 = &local_128;
                  lVar98 = lVar82;
                  do {
                    iVar92 = iVar66;
                    if (lVar74 < lVar100) {
                      iVar92 = (int)lVar74;
                    }
                    if (lVar74 < 0) {
                      iVar92 = 0;
                    }
                    auVar102 = *(undefined1 (*) [16])
                                ((long)ref +
                                (long)(iVar92 * stride) * 2 + ((ulong)(uint)(iVar97 * 2) - 0xe));
                    auVar131 = *(undefined1 (*) [16])
                                ((long)ref +
                                (long)(iVar92 * stride) * 2 + (ulong)(uint)(iVar97 * 2) + 2);
                    aWVar1 = av1_warped_filter[iVar90 >> 10];
                    iVar92 = iVar50 + iVar90 >> 10;
                    aWVar2 = av1_warped_filter[iVar89 + iVar90 >> 10];
                    iVar68 = iVar47 + iVar90 >> 10;
                    aWVar3 = av1_warped_filter[iVar86 + iVar90 >> 10];
                    iVar69 = iVar48 + iVar90 >> 10;
                    aWVar4 = av1_warped_filter[iVar49 + iVar90 >> 10];
                    iVar132 = iVar46 + iVar90 >> 10;
                    auVar156._0_8_ = aWVar1._0_8_;
                    auVar156._8_4_ = aWVar1._4_4_;
                    auVar156._12_4_ = *(undefined4 *)(av1_warped_filter[iVar92] + 2);
                    auVar155._4_4_ = *(undefined4 *)av1_warped_filter[iVar92];
                    auVar155._0_4_ = aWVar1._0_4_;
                    auVar164._0_8_ = aWVar2._0_8_;
                    auVar164._8_4_ = aWVar2._4_4_;
                    auVar164._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 2);
                    auVar155._12_4_ = *(undefined4 *)av1_warped_filter[iVar68];
                    auVar155._8_4_ = aWVar2._0_4_;
                    auVar208._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar92] + 4),aWVar1._8_4_);
                    auVar208._8_4_ = aWVar1._12_4_;
                    auVar208._12_4_ = *(undefined4 *)(av1_warped_filter[iVar92] + 6);
                    auVar142._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar68] + 4),aWVar2._8_4_);
                    auVar142._8_4_ = aWVar2._12_4_;
                    auVar142._12_4_ = *(undefined4 *)(av1_warped_filter[iVar68] + 6);
                    auVar157._8_8_ = auVar164._8_8_;
                    auVar157._0_8_ = auVar156._8_8_;
                    auVar165._8_8_ = auVar142._0_8_;
                    auVar165._0_8_ = auVar208._0_8_;
                    auVar209._8_8_ = auVar142._8_8_;
                    auVar209._0_8_ = auVar208._8_8_;
                    auVar143._0_8_ = aWVar3._0_8_;
                    auVar143._8_4_ = aWVar3._4_4_;
                    auVar143._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 2);
                    auVar215._4_4_ = *(undefined4 *)av1_warped_filter[iVar69];
                    auVar215._0_4_ = aWVar3._0_4_;
                    auVar173._0_8_ = aWVar4._0_8_;
                    auVar173._8_4_ = aWVar4._4_4_;
                    auVar173._12_4_ = *(undefined4 *)(av1_warped_filter[iVar132] + 2);
                    auVar215._12_4_ = *(undefined4 *)av1_warped_filter[iVar132];
                    auVar215._8_4_ = aWVar4._0_4_;
                    auVar227._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar69] + 4),aWVar3._8_4_);
                    auVar227._8_4_ = aWVar3._12_4_;
                    auVar227._12_4_ = *(undefined4 *)(av1_warped_filter[iVar69] + 6);
                    auVar239._0_8_ =
                         CONCAT44(*(undefined4 *)(av1_warped_filter[iVar132] + 4),aWVar4._8_4_);
                    auVar239._8_4_ = aWVar4._12_4_;
                    auVar239._12_4_ = *(undefined4 *)(av1_warped_filter[iVar132] + 6);
                    auVar144._8_8_ = auVar173._8_8_;
                    auVar144._0_8_ = auVar143._8_8_;
                    auVar163._8_8_ = auVar239._0_8_;
                    auVar163._0_8_ = auVar227._0_8_;
                    auVar138 = pmaddwd(auVar155,auVar102);
                    auVar35._16_16_ = auVar131;
                    auVar35._0_16_ = auVar102;
                    in_XMM10 = pmaddwd(auVar35._4_16_,auVar157);
                    auVar36._16_16_ = auVar131;
                    auVar36._0_16_ = auVar102;
                    auVar154 = pmaddwd(auVar36._8_16_,auVar165);
                    auVar37._16_16_ = auVar131;
                    auVar37._0_16_ = auVar102;
                    auVar122 = pmaddwd(auVar37._12_16_,auVar209);
                    auVar235._0_4_ =
                         auVar138._0_4_ + iVar99 + in_XMM10._0_4_ + auVar122._0_4_ + auVar154._0_4_
                         >> auVar116;
                    auVar235._4_4_ =
                         auVar138._4_4_ + iVar99 + in_XMM10._4_4_ + auVar122._4_4_ + auVar154._4_4_
                         >> auVar116;
                    auVar235._8_4_ =
                         auVar138._8_4_ + iVar99 + in_XMM10._8_4_ + auVar122._8_4_ + auVar154._8_4_
                         >> auVar116;
                    auVar235._12_4_ =
                         auVar138._12_4_ + iVar99 + in_XMM10._12_4_ +
                         auVar122._12_4_ + auVar154._12_4_ >> auVar116;
                    auVar228._8_8_ = auVar239._8_8_;
                    auVar228._0_8_ = auVar227._8_8_;
                    auVar38._16_16_ = auVar131;
                    auVar38._0_16_ = auVar102;
                    auVar122 = pmaddwd(auVar38._2_16_,auVar215);
                    auVar39._16_16_ = auVar131;
                    auVar39._0_16_ = auVar102;
                    auVar138 = pmaddwd(auVar39._6_16_,auVar144);
                    auVar40._16_16_ = auVar131;
                    auVar40._0_16_ = auVar102;
                    auVar154 = pmaddwd(auVar40._10_16_,auVar163);
                    auVar41._16_16_ = auVar131;
                    auVar41._0_16_ = auVar102;
                    auVar102 = pmaddwd(auVar41._14_16_,auVar228);
                    auVar158._0_4_ =
                         auVar122._0_4_ + iVar99 + auVar154._0_4_ + auVar138._0_4_ + auVar102._0_4_
                         >> auVar116;
                    auVar158._4_4_ =
                         auVar122._4_4_ + iVar99 + auVar154._4_4_ + auVar138._4_4_ + auVar102._4_4_
                         >> auVar116;
                    auVar158._8_4_ =
                         auVar122._8_4_ + iVar99 + auVar154._8_4_ + auVar138._8_4_ + auVar102._8_4_
                         >> auVar116;
                    auVar158._12_4_ =
                         auVar122._12_4_ + iVar99 + auVar154._12_4_ + auVar138._12_4_ +
                         auVar102._12_4_ >> auVar116;
                    auVar102 = packssdw(auVar235,auVar158);
                    *pauVar84 = auVar102;
                    pauVar84 = pauVar84 + 1;
                    iVar90 = iVar90 + iVar65;
                    lVar74 = lVar74 + 1;
                    lVar98 = lVar98 + -1;
                  } while (lVar98 != 0);
                  goto LAB_004109e1;
                }
              }
              else if (-7 < iVar78) {
                iVar90 = uVar96 + iVar77;
                lVar74 = (long)iVar92 + -7;
                pauVar84 = &local_128;
                lVar98 = lVar82;
                do {
                  iVar92 = iVar66;
                  if (lVar74 < lVar100) {
                    iVar92 = (int)lVar74;
                  }
                  if (lVar74 < 0) {
                    iVar92 = 0;
                  }
                  auVar102 = *(undefined1 (*) [16])
                              ((long)ref +
                              (long)(iVar92 * stride) * 2 + ((ulong)(uint)(iVar97 * 2) - 0xe));
                  auVar131 = *(undefined1 (*) [16])
                              ((long)ref +
                              (long)(iVar92 * stride) * 2 + (ulong)(uint)(iVar97 * 2) + 2);
                  iVar92 = iVar90 >> 10;
                  uVar51 = *(undefined4 *)av1_warped_filter[iVar92];
                  uVar52 = *(undefined4 *)(av1_warped_filter[iVar92] + 2);
                  uVar53 = *(undefined4 *)(av1_warped_filter[iVar92] + 4);
                  uVar54 = *(undefined4 *)(av1_warped_filter[iVar92] + 6);
                  auVar190._4_4_ = uVar51;
                  auVar190._0_4_ = uVar51;
                  auVar190._8_4_ = uVar51;
                  auVar190._12_4_ = uVar51;
                  auVar206._4_4_ = uVar52;
                  auVar206._0_4_ = uVar52;
                  auVar206._8_4_ = uVar52;
                  auVar206._12_4_ = uVar52;
                  auVar219._4_4_ = uVar53;
                  auVar219._0_4_ = uVar53;
                  auVar219._8_4_ = uVar53;
                  auVar219._12_4_ = uVar53;
                  auVar139._4_4_ = uVar54;
                  auVar139._0_4_ = uVar54;
                  auVar139._8_4_ = uVar54;
                  auVar139._12_4_ = uVar54;
                  auVar14._16_16_ = auVar131;
                  auVar14._0_16_ = auVar102;
                  auVar15._16_16_ = auVar131;
                  auVar15._0_16_ = auVar102;
                  auVar138 = pmaddwd(auVar15._8_16_,auVar219);
                  auVar16._16_16_ = auVar131;
                  auVar16._0_16_ = auVar102;
                  auVar154 = pmaddwd(auVar16._12_16_,auVar139);
                  auVar17._16_16_ = auVar131;
                  auVar17._0_16_ = auVar102;
                  auVar18._16_16_ = auVar131;
                  auVar18._0_16_ = auVar102;
                  auVar19._16_16_ = auVar131;
                  auVar19._0_16_ = auVar102;
                  auVar20._16_16_ = auVar131;
                  auVar20._0_16_ = auVar102;
                  auVar131 = pmaddwd(auVar102,auVar190);
                  auVar102 = pmaddwd(auVar14._4_16_,auVar206);
                  auVar171._0_4_ =
                       auVar131._0_4_ + iVar99 + auVar102._0_4_ + auVar154._0_4_ + auVar138._0_4_ >>
                       auVar116;
                  auVar171._4_4_ =
                       auVar131._4_4_ + iVar99 + auVar102._4_4_ + auVar154._4_4_ + auVar138._4_4_ >>
                       auVar116;
                  auVar171._8_4_ =
                       auVar131._8_4_ + iVar99 + auVar102._8_4_ + auVar154._8_4_ + auVar138._8_4_ >>
                       auVar116;
                  auVar171._12_4_ =
                       auVar131._12_4_ + iVar99 + auVar102._12_4_ +
                       auVar154._12_4_ + auVar138._12_4_ >> auVar116;
                  auVar102 = pmaddwd(auVar17._2_16_,auVar190);
                  auVar138 = pmaddwd(auVar18._6_16_,auVar206);
                  auVar154 = pmaddwd(auVar19._10_16_,auVar219);
                  auVar131 = pmaddwd(auVar20._14_16_,auVar139);
                  auVar125._0_4_ =
                       auVar102._0_4_ + iVar99 + auVar154._0_4_ + auVar138._0_4_ + auVar131._0_4_ >>
                       auVar116;
                  auVar125._4_4_ =
                       auVar102._4_4_ + iVar99 + auVar154._4_4_ + auVar138._4_4_ + auVar131._4_4_ >>
                       auVar116;
                  auVar125._8_4_ =
                       auVar102._8_4_ + iVar99 + auVar154._8_4_ + auVar138._8_4_ + auVar131._8_4_ >>
                       auVar116;
                  auVar125._12_4_ =
                       auVar102._12_4_ + iVar99 + auVar154._12_4_ + auVar138._12_4_ +
                       auVar131._12_4_ >> auVar116;
                  in_XMM10 = packssdw(auVar171,auVar125);
                  *pauVar84 = in_XMM10;
                  pauVar84 = pauVar84 + 1;
                  iVar90 = iVar90 + iVar65;
                  lVar74 = lVar74 + 1;
                  lVar98 = lVar98 + -1;
                } while (lVar98 != 0);
                goto LAB_004109e1;
              }
            }
          }
          else if (-7 < iVar78) {
            lVar98 = -7;
            pauVar84 = &local_128;
            do {
              iVar97 = iVar92 + (int)lVar98;
              if (lVar100 <= iVar92 + lVar98) {
                iVar97 = iVar66;
              }
              if (iVar92 + lVar98 < 0) {
                iVar97 = 0;
              }
              auVar102 = ZEXT416(((uint)ref[iVar97 * stride + width + -1] << (7 - bVar45 & 0x1f)) +
                                 iVar83);
              auVar102 = pshuflw(auVar102,auVar102,0);
              auVar102._4_4_ = auVar102._0_4_;
              auVar102._8_4_ = auVar102._0_4_;
              auVar102._12_4_ = auVar102._0_4_;
              *pauVar84 = auVar102;
              lVar98 = lVar98 + 1;
              pauVar84 = pauVar84 + 1;
            } while (lVar98 < lVar71);
            goto LAB_004109e1;
          }
          iVar79 = iVar79 + 8;
          local_2d4 = local_2d4 + 8;
        } while (iVar79 < p_width);
      }
      iVar87 = iVar87 + 8;
      iVar81 = iVar81 + -8;
      local_2f4 = local_2f4 + p_stride * 8;
    } while (iVar87 < p_height);
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_sse4_1(const int32_t *mat, const uint16_t *ref,
                                   int width, int height, int stride,
                                   uint16_t *pred, int p_col, int p_row,
                                   int p_width, int p_height, int p_stride,
                                   int subsampling_x, int subsampling_y, int bd,
                                   ConvolveParams *conv_params, int16_t alpha,
                                   int16_t beta, int16_t gamma, int16_t delta) {
  __m128i tmp[15];
  int i, j, k;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));
  assert(!(bd == 12 && reduce_bits_horiz < 5));
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i reduce_bits_vert_shift = _mm_cvtsi32_si128(reduce_bits_vert);
  const __m128i reduce_bits_vert_const =
      _mm_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const __m128i res_sub_const =
      _mm_set1_epi32(-(1 << (offset_bits - conv_params->round_1)) -
                     (1 << (offset_bits - conv_params->round_1 - 1)));
  __m128i round_bits_shift = _mm_cvtsi32_si128(round_bits);
  __m128i round_bits_const = _mm_set1_epi32(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  /* Note: For this code to work, the left/right frame borders need to be
  extended by at least 13 pixels each. By the time we get here, other
  code will have set up this border, but we allow an explicit check
  for debugging purposes.
  */
  /*for (i = 0; i < height; ++i) {
  for (j = 0; j < 13; ++j) {
  assert(ref[i * stride - 13 + j] == ref[i * stride]);
  assert(ref[i * stride + width + j] == ref[i * stride + (width - 1)]);
  }
  }*/

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.
      if (ix4 <= -7) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (ix4 >= width + 6) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] =
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;

        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          int sx = sx4 + beta * (k + 4);

          // Load source pixels
          const __m128i src =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          const __m128i src2 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 + 1));

          const __m128i src_01 = _mm_shuffle_epi8(
              src, _mm_loadu_si128((__m128i *)warp_highbd_arrange_bytes));
          const __m128i src2_01 = _mm_shuffle_epi8(
              src2, _mm_loadu_si128((__m128i *)warp_highbd_arrange_bytes));

          __m128i src_lo = _mm_unpacklo_epi64(src_01, src2_01);
          __m128i src_hi = _mm_unpackhi_epi64(src_01, src2_01);

          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src_lo = _mm_shuffle_epi8(src_lo, shuffle_reg_left);
            src_hi = _mm_shuffle_epi8(src_hi, shuffle_reg_left);
          }

          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src_lo = _mm_shuffle_epi8(src_lo, shuffle_reg_right);
            src_hi = _mm_shuffle_epi8(src_hi, shuffle_reg_right);
          }

          const __m128i src_padded = _mm_unpacklo_epi8(src_lo, src_hi);
          const __m128i src2_padded = _mm_unpackhi_epi8(src_lo, src_hi);

          highbd_horiz_filter(&src_padded, &src2_padded, tmp, sx, alpha, k,
                              offset_bits_horiz, reduce_bits_horiz);
        }
      } else {
        highbd_prepare_warp_horizontal_filter(
            ref, tmp, stride, ix4, iy4, sx4, alpha, beta, p_height, height, i,
            offset_bits_horiz, reduce_bits_horiz);
      }

      // Vertical filter
      for (k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);

        // Load from tmp and rearrange pairs of consecutive rows into the
        // column order 0 0 2 2 4 4 6 6; 1 1 3 3 5 5 7 7
        const __m128i *src = tmp + (k + 4);
        const __m128i src_0 = _mm_unpacklo_epi16(src[0], src[1]);
        const __m128i src_2 = _mm_unpacklo_epi16(src[2], src[3]);
        const __m128i src_4 = _mm_unpacklo_epi16(src[4], src[5]);
        const __m128i src_6 = _mm_unpacklo_epi16(src[6], src[7]);

        // Filter even-index pixels
        const __m128i tmp_0 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 0 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_2 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 2 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_4 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 4 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_6 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 6 * gamma) >> WARPEDDIFF_PREC_BITS)));

        const __m128i tmp_8 = _mm_unpacklo_epi32(tmp_0, tmp_2);
        const __m128i tmp_10 = _mm_unpacklo_epi32(tmp_4, tmp_6);
        const __m128i tmp_12 = _mm_unpackhi_epi32(tmp_0, tmp_2);
        const __m128i tmp_14 = _mm_unpackhi_epi32(tmp_4, tmp_6);

        const __m128i coeff_0 = _mm_unpacklo_epi64(tmp_8, tmp_10);
        const __m128i coeff_2 = _mm_unpackhi_epi64(tmp_8, tmp_10);
        const __m128i coeff_4 = _mm_unpacklo_epi64(tmp_12, tmp_14);
        const __m128i coeff_6 = _mm_unpackhi_epi64(tmp_12, tmp_14);

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_0);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_2);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_4);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_6);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 = _mm_unpackhi_epi16(src[0], src[1]);
        const __m128i src_3 = _mm_unpackhi_epi16(src[2], src[3]);
        const __m128i src_5 = _mm_unpackhi_epi16(src[4], src[5]);
        const __m128i src_7 = _mm_unpackhi_epi16(src[6], src[7]);

        const __m128i tmp_1 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 1 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_3 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 3 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_5 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 5 * gamma) >> WARPEDDIFF_PREC_BITS)));
        const __m128i tmp_7 = _mm_loadu_si128(
            (__m128i *)(av1_warped_filter +
                        ((sy + 7 * gamma) >> WARPEDDIFF_PREC_BITS)));

        const __m128i tmp_9 = _mm_unpacklo_epi32(tmp_1, tmp_3);
        const __m128i tmp_11 = _mm_unpacklo_epi32(tmp_5, tmp_7);
        const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_1, tmp_3);
        const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_5, tmp_7);

        const __m128i coeff_1 = _mm_unpacklo_epi64(tmp_9, tmp_11);
        const __m128i coeff_3 = _mm_unpackhi_epi64(tmp_9, tmp_11);
        const __m128i coeff_5 = _mm_unpacklo_epi64(tmp_13, tmp_15);
        const __m128i coeff_7 = _mm_unpackhi_epi64(tmp_13, tmp_15);

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_1);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_3);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_5);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_7);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        if (conv_params->is_compound) {
          __m128i *const p =
              (__m128i *)&conv_params
                  ->dst[(i + k + 4) * conv_params->dst_stride + j];
          res_lo = _mm_add_epi32(res_lo, res_add_const);
          res_lo = _mm_sra_epi32(_mm_add_epi32(res_lo, reduce_bits_vert_const),
                                 reduce_bits_vert_shift);

          if (conv_params->do_average) {
            __m128i *const dst16 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
            __m128i p_32 = _mm_cvtepu16_epi32(_mm_loadl_epi64(p));

            if (conv_params->use_dist_wtd_comp_avg) {
              res_lo = _mm_add_epi32(_mm_mullo_epi32(p_32, wt0),
                                     _mm_mullo_epi32(res_lo, wt1));
              res_lo = _mm_srai_epi32(res_lo, DIST_PRECISION_BITS);
            } else {
              res_lo = _mm_srai_epi32(_mm_add_epi32(p_32, res_lo), 1);
            }

            __m128i res32_lo = _mm_add_epi32(res_lo, res_sub_const);
            res32_lo = _mm_sra_epi32(_mm_add_epi32(res32_lo, round_bits_const),
                                     round_bits_shift);

            __m128i res16_lo = _mm_packus_epi32(res32_lo, res32_lo);
            res16_lo = _mm_min_epi16(res16_lo, clip_pixel);
            _mm_storel_epi64(dst16, res16_lo);
          } else {
            res_lo = _mm_packus_epi32(res_lo, res_lo);
            _mm_storel_epi64(p, res_lo);
          }
          if (p_width > 4) {
            __m128i *const p4 =
                (__m128i *)&conv_params
                    ->dst[(i + k + 4) * conv_params->dst_stride + j + 4];

            res_hi = _mm_add_epi32(res_hi, res_add_const);
            res_hi =
                _mm_sra_epi32(_mm_add_epi32(res_hi, reduce_bits_vert_const),
                              reduce_bits_vert_shift);
            if (conv_params->do_average) {
              __m128i *const dst16_4 =
                  (__m128i *)&pred[(i + k + 4) * p_stride + j + 4];
              __m128i p4_32 = _mm_cvtepu16_epi32(_mm_loadl_epi64(p4));

              if (conv_params->use_dist_wtd_comp_avg) {
                res_hi = _mm_add_epi32(_mm_mullo_epi32(p4_32, wt0),
                                       _mm_mullo_epi32(res_hi, wt1));
                res_hi = _mm_srai_epi32(res_hi, DIST_PRECISION_BITS);
              } else {
                res_hi = _mm_srai_epi32(_mm_add_epi32(p4_32, res_hi), 1);
              }

              __m128i res32_hi = _mm_add_epi32(res_hi, res_sub_const);
              res32_hi = _mm_sra_epi32(
                  _mm_add_epi32(res32_hi, round_bits_const), round_bits_shift);
              __m128i res16_hi = _mm_packus_epi32(res32_hi, res32_hi);
              res16_hi = _mm_min_epi16(res16_hi, clip_pixel);
              _mm_storel_epi64(dst16_4, res16_hi);
            } else {
              res_hi = _mm_packus_epi32(res_hi, res_hi);
              _mm_storel_epi64(p4, res_hi);
            }
          }
        } else {
          // Round and pack into 8 bits
          const __m128i round_const =
              _mm_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                             ((1 << reduce_bits_vert) >> 1));

          const __m128i res_lo_round = _mm_srai_epi32(
              _mm_add_epi32(res_lo, round_const), reduce_bits_vert);
          const __m128i res_hi_round = _mm_srai_epi32(
              _mm_add_epi32(res_hi, round_const), reduce_bits_vert);

          __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
          // Clamp res_16bit to the range [0, 2^bd - 1]
          const __m128i max_val = _mm_set1_epi16((1 << bd) - 1);
          const __m128i zero = _mm_setzero_si128();
          res_16bit = _mm_max_epi16(_mm_min_epi16(res_16bit, max_val), zero);

          // Store, blending with 'pred' if needed
          __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

          // Note: If we're outputting a 4x4 block, we need to be very careful
          // to only output 4 pixels at this point, to avoid encode/decode
          // mismatches when encoding with multiple threads.
          if (p_width == 4) {
            _mm_storel_epi64(p, res_16bit);
          } else {
            _mm_storeu_si128(p, res_16bit);
          }
        }
      }
    }
  }
}